

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int handle_transport_close_frame(quicly_conn_t *conn,st_quicly_handle_payload_state_t *state)

{
  uint8_t *end;
  uint8_t *puVar1;
  int iVar2;
  uint64_t uVar3;
  uint64_t frame_type;
  uint64_t uVar4;
  ptls_iovec_t reason_phrase;
  
  end = state->end;
  uVar3 = ptls_decode_quicint(&state->src,end);
  if (uVar3 != 0xffffffffffffffff) {
    frame_type = ptls_decode_quicint(&state->src,end);
    if (frame_type != 0xffffffffffffffff) {
      uVar4 = ptls_decode_quicint(&state->src,end);
      if ((uVar4 != 0xffffffffffffffff) &&
         (puVar1 = state->src, uVar4 <= (ulong)((long)end - (long)puVar1))) {
        state->src = puVar1 + uVar4;
        reason_phrase.len = uVar4;
        reason_phrase.base = puVar1;
        iVar2 = handle_close(conn,(uint)uVar3 & 0xffff | 0x20000,frame_type,reason_phrase);
        return iVar2;
      }
    }
  }
  return 0x20007;
}

Assistant:

static int handle_transport_close_frame(quicly_conn_t *conn, struct st_quicly_handle_payload_state_t *state)
{
    quicly_transport_close_frame_t frame;
    int ret;

    if ((ret = quicly_decode_transport_close_frame(&state->src, state->end, &frame)) != 0)
        return ret;

    QUICLY_PROBE(TRANSPORT_CLOSE_RECEIVE, conn, conn->stash.now, frame.error_code, frame.frame_type,
                 QUICLY_PROBE_ESCAPE_UNSAFE_STRING(frame.reason_phrase.base, frame.reason_phrase.len));
    return handle_close(conn, QUICLY_ERROR_FROM_TRANSPORT_ERROR_CODE(frame.error_code), frame.frame_type, frame.reason_phrase);
}